

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  ulong uVar4;
  Geometry *pGVar5;
  RTCRayQueryContext *pRVar6;
  float fVar7;
  undefined1 (*pauVar8) [16];
  int iVar9;
  undefined4 uVar10;
  ulong uVar11;
  int *piVar12;
  Scene *pSVar13;
  RayQueryContext *pRVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int *piVar22;
  undefined1 (*pauVar23) [16];
  undefined4 uVar24;
  ulong unaff_R12;
  long lVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  float fVar30;
  float fVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  float fVar47;
  float fVar48;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar49;
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar62;
  float fVar63;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar64;
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar70;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar71;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar72 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_117c;
  undefined8 local_1178;
  float fStack_1170;
  float fStack_116c;
  undefined1 local_1168 [16];
  RTCIntersectArguments *local_1150;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  RTCFilterFunctionNArguments local_1138;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  Geometry *local_10f8;
  int *local_10f0;
  float local_10e8;
  float local_10e4;
  undefined4 local_10e0;
  float local_10dc;
  float local_10d8;
  undefined4 local_10d4;
  uint local_10d0;
  uint local_10cc;
  uint local_10c8;
  undefined1 local_10b8 [8];
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1068 [16];
  float local_1058 [4];
  float local_1048 [4];
  float local_1038 [4];
  undefined1 local_1028 [16];
  float local_1018 [4];
  undefined1 local_1008 [16];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      pauVar23 = (undefined1 (*) [16])local_f68;
      local_fc8 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_fd8 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_f98 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar70 = (ray->super_RayK<1>).dir.field_0.m128[0];
      fVar39 = (ray->super_RayK<1>).dir.field_0.m128[1];
      fVar47 = (ray->super_RayK<1>).dir.field_0.m128[2];
      fVar48 = (ray->super_RayK<1>).dir.field_0.m128[3];
      fVar67 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_fa8 = 0.0;
      if (0.0 <= fVar67) {
        local_fa8 = fVar67;
      }
      fVar67 = (ray->super_RayK<1>).tfar;
      fVar49 = 0.0;
      if (0.0 <= fVar67) {
        fVar49 = fVar67;
      }
      uVar26 = -(uint)((float)DAT_01ff1d40 <= ABS(fVar70));
      uVar27 = -(uint)(DAT_01ff1d40._4_4_ <= ABS(fVar39));
      uVar28 = -(uint)(DAT_01ff1d40._8_4_ <= ABS(fVar47));
      uVar29 = -(uint)(DAT_01ff1d40._12_4_ <= ABS(fVar48));
      auVar35._0_4_ = (uint)fVar70 & uVar26;
      auVar35._4_4_ = (uint)fVar39 & uVar27;
      auVar35._8_4_ = (uint)fVar47 & uVar28;
      auVar35._12_4_ = (uint)fVar48 & uVar29;
      auVar50._0_4_ = ~uVar26 & (uint)(float)DAT_01ff1d40;
      auVar50._4_4_ = ~uVar27 & (uint)DAT_01ff1d40._4_4_;
      auVar50._8_4_ = ~uVar28 & (uint)DAT_01ff1d40._8_4_;
      auVar50._12_4_ = ~uVar29 & (uint)DAT_01ff1d40._12_4_;
      auVar50 = auVar50 | auVar35;
      auVar40 = rcpps(auVar35,auVar50);
      local_fe8 = auVar40._0_4_;
      local_ff8 = auVar40._4_4_;
      local_fb8 = auVar40._8_4_;
      local_fe8 = (1.0 - auVar50._0_4_ * local_fe8) * local_fe8 + local_fe8;
      local_ff8 = (1.0 - auVar50._4_4_ * local_ff8) * local_ff8 + local_ff8;
      local_fb8 = (1.0 - auVar50._8_4_ * local_fb8) * local_fb8 + local_fb8;
      uVar18 = (ulong)(local_fe8 < 0.0) * 0x10;
      uVar19 = (ulong)(local_ff8 < 0.0) << 4 | 0x20;
      uVar20 = (ulong)(local_fb8 < 0.0) << 4 | 0x40;
      auVar40._4_4_ = fVar49;
      auVar40._0_4_ = fVar49;
      auVar40._8_4_ = fVar49;
      auVar40._12_4_ = fVar49;
      _local_f88 = mm_lookupmask_ps._240_8_;
      _uStack_f80 = mm_lookupmask_ps._248_8_;
      fStack_f94 = local_f98;
      fStack_f90 = local_f98;
      fStack_f8c = local_f98;
      fStack_fa4 = local_fa8;
      fStack_fa0 = local_fa8;
      fStack_f9c = local_fa8;
      fStack_fb4 = local_fb8;
      fStack_fb0 = local_fb8;
      fStack_fac = local_fb8;
      fStack_fc4 = local_fc8;
      fStack_fc0 = local_fc8;
      fStack_fbc = local_fc8;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      fStack_ff4 = local_ff8;
      fStack_ff0 = local_ff8;
      fStack_fec = local_ff8;
      local_1178 = context;
      fVar67 = local_f98;
      fVar70 = local_f98;
      fVar39 = local_f98;
      fVar47 = local_f98;
      fVar48 = local_fa8;
      fVar49 = local_fa8;
      fVar78 = local_fa8;
      fVar80 = local_fa8;
      fVar82 = local_fb8;
      fVar84 = local_fb8;
      fVar86 = local_fb8;
      fVar88 = local_fb8;
      fVar90 = local_fc8;
      fVar91 = local_fc8;
      fVar92 = local_fc8;
      fVar93 = local_fc8;
      fVar94 = local_fd8;
      fVar96 = local_fd8;
      fVar98 = local_fd8;
      fVar100 = local_fd8;
      fVar64 = local_fe8;
      fVar101 = local_fe8;
      fVar75 = local_fe8;
      fVar105 = local_fe8;
      fVar107 = local_ff8;
      fVar108 = local_ff8;
      fVar109 = local_ff8;
      fVar110 = local_ff8;
      do {
        do {
          do {
            if (pauVar23 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar8 = pauVar23 + -1;
            pauVar23 = pauVar23 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar8 + 8));
          uVar16 = *(ulong *)*pauVar23;
          do {
            if ((uVar16 & 8) == 0) {
              pfVar1 = (float *)(uVar16 + 0x20 + uVar18);
              auVar66._0_4_ = (*pfVar1 - fVar90) * fVar64;
              auVar66._4_4_ = (pfVar1[1] - fVar91) * fVar101;
              auVar66._8_4_ = (pfVar1[2] - fVar92) * fVar75;
              auVar66._12_4_ = (pfVar1[3] - fVar93) * fVar105;
              pfVar1 = (float *)(uVar16 + 0x20 + uVar19);
              auVar41._0_4_ = (*pfVar1 - fVar94) * fVar107;
              auVar41._4_4_ = (pfVar1[1] - fVar96) * fVar108;
              auVar41._8_4_ = (pfVar1[2] - fVar98) * fVar109;
              auVar41._12_4_ = (pfVar1[3] - fVar100) * fVar110;
              auVar35 = maxps(auVar66,auVar41);
              pfVar1 = (float *)(uVar16 + 0x20 + uVar20);
              auVar42._0_4_ = (*pfVar1 - fVar67) * fVar82;
              auVar42._4_4_ = (pfVar1[1] - fVar70) * fVar84;
              auVar42._8_4_ = (pfVar1[2] - fVar39) * fVar86;
              auVar42._12_4_ = (pfVar1[3] - fVar47) * fVar88;
              auVar60._4_4_ = fVar49;
              auVar60._0_4_ = fVar48;
              auVar60._8_4_ = fVar78;
              auVar60._12_4_ = fVar80;
              auVar50 = maxps(auVar42,auVar60);
              _local_10b8 = maxps(auVar35,auVar50);
              pfVar1 = (float *)(uVar16 + 0x20 + (uVar18 ^ 0x10));
              auVar43._0_4_ = (*pfVar1 - fVar90) * fVar64;
              auVar43._4_4_ = (pfVar1[1] - fVar91) * fVar101;
              auVar43._8_4_ = (pfVar1[2] - fVar92) * fVar75;
              auVar43._12_4_ = (pfVar1[3] - fVar93) * fVar105;
              pfVar1 = (float *)(uVar16 + 0x20 + (uVar19 ^ 0x10));
              auVar51._0_4_ = (*pfVar1 - fVar94) * fVar107;
              auVar51._4_4_ = (pfVar1[1] - fVar96) * fVar108;
              auVar51._8_4_ = (pfVar1[2] - fVar98) * fVar109;
              auVar51._12_4_ = (pfVar1[3] - fVar100) * fVar110;
              auVar35 = minps(auVar43,auVar51);
              pfVar1 = (float *)(uVar16 + 0x20 + (uVar20 ^ 0x10));
              auVar52._0_4_ = (*pfVar1 - fVar67) * fVar82;
              auVar52._4_4_ = (pfVar1[1] - fVar70) * fVar84;
              auVar52._8_4_ = (pfVar1[2] - fVar39) * fVar86;
              auVar52._12_4_ = (pfVar1[3] - fVar47) * fVar88;
              auVar50 = minps(auVar52,auVar40);
              auVar35 = minps(auVar35,auVar50);
              auVar69._4_4_ = -(uint)(local_10b8._4_4_ <= auVar35._4_4_);
              auVar69._0_4_ = -(uint)(local_10b8._0_4_ <= auVar35._0_4_);
              auVar69._8_4_ = -(uint)(local_10b8._8_4_ <= auVar35._8_4_);
              auVar69._12_4_ = -(uint)(local_10b8._12_4_ <= auVar35._12_4_);
              uVar24 = movmskps((int)unaff_R12,auVar69);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar24);
            }
            if ((uVar16 & 8) == 0) {
              if (unaff_R12 == 0) {
                uVar11 = 4;
              }
              else {
                uVar15 = uVar16 & 0xfffffffffffffff0;
                lVar17 = 0;
                if (unaff_R12 != 0) {
                  for (; (unaff_R12 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                  }
                }
                uVar11 = 0;
                uVar16 = *(ulong *)(uVar15 + lVar17 * 8);
                uVar21 = unaff_R12 - 1 & unaff_R12;
                if (uVar21 != 0) {
                  uVar26 = *(uint *)(local_10b8 + lVar17 * 4);
                  lVar17 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                    }
                  }
                  uVar4 = *(ulong *)(uVar15 + lVar17 * 8);
                  uVar27 = *(uint *)(local_10b8 + lVar17 * 4);
                  uVar21 = uVar21 - 1 & uVar21;
                  if (uVar21 == 0) {
                    if (uVar26 < uVar27) {
                      *(ulong *)*pauVar23 = uVar4;
                      *(uint *)((long)*pauVar23 + 8) = uVar27;
                      pauVar23 = pauVar23 + 1;
                    }
                    else {
                      *(ulong *)*pauVar23 = uVar16;
                      *(uint *)((long)*pauVar23 + 8) = uVar26;
                      uVar16 = uVar4;
                      pauVar23 = pauVar23 + 1;
                    }
                  }
                  else {
                    auVar36._8_4_ = uVar26;
                    auVar36._0_8_ = uVar16;
                    auVar36._12_4_ = 0;
                    auVar44._8_4_ = uVar27;
                    auVar44._0_8_ = uVar4;
                    auVar44._12_4_ = 0;
                    lVar17 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                      }
                    }
                    uVar16 = *(ulong *)(uVar15 + lVar17 * 8);
                    iVar9 = *(int *)(local_10b8 + lVar17 * 4);
                    auVar53._8_4_ = iVar9;
                    auVar53._0_8_ = uVar16;
                    auVar53._12_4_ = 0;
                    auVar57._8_4_ = -(uint)((int)uVar26 < (int)uVar27);
                    uVar21 = uVar21 - 1 & uVar21;
                    if (uVar21 == 0) {
                      auVar57._4_4_ = auVar57._8_4_;
                      auVar57._0_4_ = auVar57._8_4_;
                      auVar57._12_4_ = auVar57._8_4_;
                      auVar35 = auVar36 & auVar57 | ~auVar57 & auVar44;
                      auVar50 = auVar44 & auVar57 | ~auVar57 & auVar36;
                      auVar58._8_4_ = -(uint)(auVar35._8_4_ < iVar9);
                      auVar58._0_8_ = CONCAT44(auVar58._8_4_,auVar58._8_4_);
                      auVar58._12_4_ = auVar58._8_4_;
                      uVar16 = ~auVar58._0_8_ & uVar16 | auVar35._0_8_ & auVar58._0_8_;
                      auVar35 = auVar53 & auVar58 | ~auVar58 & auVar35;
                      auVar37._8_4_ = -(uint)(auVar50._8_4_ < auVar35._8_4_);
                      auVar37._4_4_ = auVar37._8_4_;
                      auVar37._0_4_ = auVar37._8_4_;
                      auVar37._12_4_ = auVar37._8_4_;
                      *pauVar23 = ~auVar37 & auVar50 | auVar35 & auVar37;
                      pauVar23[1] = auVar50 & auVar37 | ~auVar37 & auVar35;
                      pauVar23 = pauVar23 + 2;
                    }
                    else {
                      lVar17 = 0;
                      if (uVar21 != 0) {
                        for (; (uVar21 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
                        }
                      }
                      iVar3 = *(int *)(local_10b8 + lVar17 * 4);
                      auVar65._8_4_ = iVar3;
                      auVar65._0_8_ = *(undefined8 *)(uVar15 + lVar17 * 8);
                      auVar65._12_4_ = 0;
                      auVar59._4_4_ = auVar57._8_4_;
                      auVar59._0_4_ = auVar57._8_4_;
                      auVar59._8_4_ = auVar57._8_4_;
                      auVar59._12_4_ = auVar57._8_4_;
                      auVar35 = auVar36 & auVar59 | ~auVar59 & auVar44;
                      auVar50 = auVar44 & auVar59 | ~auVar59 & auVar36;
                      auVar68._0_4_ = -(uint)(iVar9 < iVar3);
                      auVar68._4_4_ = -(uint)(iVar9 < iVar3);
                      auVar68._8_4_ = -(uint)(iVar9 < iVar3);
                      auVar68._12_4_ = -(uint)(iVar9 < iVar3);
                      auVar60 = auVar53 & auVar68 | ~auVar68 & auVar65;
                      auVar69 = ~auVar68 & auVar53 | auVar65 & auVar68;
                      auVar54._8_4_ = -(uint)(auVar50._8_4_ < auVar69._8_4_);
                      auVar54._4_4_ = auVar54._8_4_;
                      auVar54._0_4_ = auVar54._8_4_;
                      auVar54._12_4_ = auVar54._8_4_;
                      auVar66 = auVar50 & auVar54 | ~auVar54 & auVar69;
                      auVar45._8_4_ = -(uint)(auVar35._8_4_ < auVar60._8_4_);
                      auVar45._0_8_ = CONCAT44(auVar45._8_4_,auVar45._8_4_);
                      auVar45._12_4_ = auVar45._8_4_;
                      uVar16 = auVar35._0_8_ & auVar45._0_8_ | ~auVar45._0_8_ & auVar60._0_8_;
                      auVar35 = ~auVar45 & auVar35 | auVar60 & auVar45;
                      auVar38._8_4_ = -(uint)(auVar35._8_4_ < auVar66._8_4_);
                      auVar38._4_4_ = auVar38._8_4_;
                      auVar38._0_4_ = auVar38._8_4_;
                      auVar38._12_4_ = auVar38._8_4_;
                      *pauVar23 = ~auVar54 & auVar50 | auVar69 & auVar54;
                      pauVar23[1] = ~auVar38 & auVar35 | auVar66 & auVar38;
                      pauVar23[2] = auVar35 & auVar38 | ~auVar38 & auVar66;
                      pauVar23 = pauVar23 + 3;
                    }
                  }
                }
              }
            }
            else {
              uVar11 = 6;
            }
          } while ((int)uVar11 == 0);
        } while ((int)uVar11 != 6);
        uVar15 = (ulong)((uint)uVar16 & 0xf);
        if (uVar15 != 8) {
          uVar16 = uVar16 & 0xfffffffffffffff0;
          lVar17 = 0;
          pRVar14 = local_1178;
          do {
            lVar25 = lVar17 * 0xb0;
            pfVar1 = (float *)(uVar16 + 0x80 + lVar25);
            fVar67 = *pfVar1;
            fVar70 = pfVar1[1];
            fVar39 = pfVar1[2];
            fVar47 = pfVar1[3];
            pfVar1 = (float *)(uVar16 + 0x40 + lVar25);
            fVar48 = *pfVar1;
            fVar49 = pfVar1[1];
            fVar78 = pfVar1[2];
            fVar80 = pfVar1[3];
            pfVar1 = (float *)(uVar16 + 0x70 + lVar25);
            fVar82 = *pfVar1;
            fVar84 = pfVar1[1];
            fVar86 = pfVar1[2];
            fVar88 = pfVar1[3];
            pfVar1 = (float *)(uVar16 + 0x50 + lVar25);
            fVar90 = *pfVar1;
            fVar91 = pfVar1[1];
            fVar92 = pfVar1[2];
            fVar93 = pfVar1[3];
            local_1148 = fVar82 * fVar90 - fVar67 * fVar48;
            fStack_1144 = fVar84 * fVar91 - fVar70 * fVar49;
            fStack_1140 = fVar86 * fVar92 - fVar39 * fVar78;
            fStack_113c = fVar88 * fVar93 - fVar47 * fVar80;
            pfVar1 = (float *)(uVar16 + 0x60 + lVar25);
            fVar94 = *pfVar1;
            fVar96 = pfVar1[1];
            fVar98 = pfVar1[2];
            fVar100 = pfVar1[3];
            pfVar1 = (float *)(uVar16 + lVar25);
            pfVar2 = (float *)(uVar16 + 0x10 + lVar25);
            fStack_116c = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar64 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar101 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar75 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar105 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar107 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar30 = *pfVar1 - fStack_116c;
            fVar34 = pfVar1[1] - fStack_116c;
            fStack_1170 = pfVar1[2] - fStack_116c;
            fStack_116c = pfVar1[3] - fStack_116c;
            fVar56 = *pfVar2 - fVar64;
            fVar62 = pfVar2[1] - fVar64;
            fVar63 = pfVar2[2] - fVar64;
            fVar64 = pfVar2[3] - fVar64;
            fVar102 = fVar30 * fVar105 - fVar75 * fVar56;
            fVar103 = fVar34 * fVar105 - fVar75 * fVar62;
            fVar104 = fStack_1170 * fVar105 - fVar75 * fVar63;
            fVar106 = fStack_116c * fVar105 - fVar75 * fVar64;
            pfVar1 = (float *)(uVar16 + 0x30 + lVar25);
            fVar108 = *pfVar1;
            fVar109 = pfVar1[1];
            fVar110 = pfVar1[2];
            fVar7 = pfVar1[3];
            local_1018[0] = fVar67 * fVar108 - fVar90 * fVar94;
            local_1018[1] = fVar70 * fVar109 - fVar91 * fVar96;
            local_1018[2] = fVar39 * fVar110 - fVar92 * fVar98;
            local_1018[3] = fVar47 * fVar7 - fVar93 * fVar100;
            pfVar1 = (float *)(uVar16 + 0x20 + lVar25);
            fVar95 = *pfVar1 - fVar101;
            fVar97 = pfVar1[1] - fVar101;
            fVar99 = pfVar1[2] - fVar101;
            fVar101 = pfVar1[3] - fVar101;
            local_1178 = (RayQueryContext *)CONCAT44(fVar34,fVar30);
            fVar83 = fVar75 * fVar95 - fVar30 * fVar107;
            fVar85 = fVar75 * fVar97 - fVar34 * fVar107;
            fVar87 = fVar75 * fVar99 - fStack_1170 * fVar107;
            fVar89 = fVar75 * fVar101 - fStack_116c * fVar107;
            local_1008._0_4_ = fVar48 * fVar94 - fVar82 * fVar108;
            local_1008._4_4_ = fVar49 * fVar96 - fVar84 * fVar109;
            local_1008._8_4_ = fVar78 * fVar98 - fVar86 * fVar110;
            local_1008._12_4_ = fVar80 * fVar100 - fVar88 * fVar7;
            fVar76 = fVar107 * fVar56 - fVar105 * fVar95;
            fVar77 = fVar107 * fVar62 - fVar105 * fVar97;
            fVar79 = fVar107 * fVar63 - fVar105 * fVar99;
            fVar81 = fVar107 * fVar64 - fVar105 * fVar101;
            fVar71 = fVar105 * local_1018[0] + fVar107 * local_1008._0_4_ + local_1148 * fVar75;
            fVar73 = fVar105 * local_1018[1] + fVar107 * local_1008._4_4_ + fStack_1144 * fVar75;
            fVar74 = fVar105 * local_1018[2] + fVar107 * local_1008._8_4_ + fStack_1140 * fVar75;
            fVar75 = fVar105 * local_1018[3] + fVar107 * local_1008._12_4_ + fStack_113c * fVar75;
            uVar26 = (uint)fVar71 & 0x80000000;
            uVar27 = (uint)fVar73 & 0x80000000;
            uVar28 = (uint)fVar74 & 0x80000000;
            uVar29 = (uint)fVar75 & 0x80000000;
            local_10b8._0_4_ = (uint)(fVar94 * fVar76 + fVar82 * fVar83 + fVar67 * fVar102) ^ uVar26
            ;
            local_10b8._4_4_ = (uint)(fVar96 * fVar77 + fVar84 * fVar85 + fVar70 * fVar103) ^ uVar27
            ;
            fStack_10b0 = (float)((uint)(fVar98 * fVar79 + fVar86 * fVar87 + fVar39 * fVar104) ^
                                 uVar28);
            fStack_10ac = (float)((uint)(fVar100 * fVar81 + fVar88 * fVar89 + fVar47 * fVar106) ^
                                 uVar29);
            local_10a8 = (float)((uint)(fVar76 * fVar108 + fVar83 * fVar48 + fVar102 * fVar90) ^
                                uVar26);
            fStack_10a4 = (float)((uint)(fVar77 * fVar109 + fVar85 * fVar49 + fVar103 * fVar91) ^
                                 uVar27);
            fStack_10a0 = (float)((uint)(fVar79 * fVar110 + fVar87 * fVar78 + fVar104 * fVar92) ^
                                 uVar28);
            fStack_109c = (float)((uint)(fVar81 * fVar7 + fVar89 * fVar80 + fVar106 * fVar93) ^
                                 uVar29);
            fVar67 = ABS(fVar71);
            fVar70 = ABS(fVar73);
            local_1088._0_8_ = CONCAT44(fVar73,fVar71) & 0x7fffffff7fffffff;
            local_1088._8_4_ = ABS(fVar74);
            local_1088._12_4_ = ABS(fVar75);
            auVar72._0_4_ =
                 -(uint)((float)local_10b8._0_4_ + local_10a8 <= fVar67) &
                 -(uint)((0.0 <= local_10a8 && 0.0 <= (float)local_10b8._0_4_) && fVar71 != 0.0) &
                 local_f88;
            auVar72._4_4_ =
                 -(uint)((float)local_10b8._4_4_ + fStack_10a4 <= fVar70) &
                 -(uint)((0.0 <= fStack_10a4 && 0.0 <= (float)local_10b8._4_4_) && fVar73 != 0.0) &
                 uStack_f84;
            auVar72._8_4_ =
                 -(uint)(fStack_10b0 + fStack_10a0 <= local_1088._8_4_) &
                 -(uint)((0.0 <= fStack_10a0 && 0.0 <= fStack_10b0) && fVar74 != 0.0) & uStack_f80;
            auVar72._12_4_ =
                 -(uint)(fStack_10ac + fStack_109c <= local_1088._12_4_) &
                 -(uint)((0.0 <= fStack_109c && 0.0 <= fStack_10ac) && fVar75 != 0.0) & uStack_f7c;
            uVar24 = (undefined4)(uVar11 >> 0x20);
            iVar9 = movmskps((int)uVar11,auVar72);
            uVar11 = CONCAT44(uVar24,iVar9);
            local_1178 = pRVar14;
            if (iVar9 != 0) {
              local_1098._0_4_ =
                   (float)(uVar26 ^ (uint)(fVar30 * local_1148 +
                                          fVar56 * local_1018[0] + fVar95 * local_1008._0_4_));
              local_1098._4_4_ =
                   (float)(uVar27 ^ (uint)(fVar34 * fStack_1144 +
                                          fVar62 * local_1018[1] + fVar97 * local_1008._4_4_));
              local_1098._8_4_ =
                   (float)(uVar28 ^ (uint)(fStack_1170 * fStack_1140 +
                                          fVar63 * local_1018[2] + fVar99 * local_1008._8_4_));
              local_1098._12_4_ =
                   (float)(uVar29 ^ (uint)(fStack_116c * fStack_113c +
                                          fVar64 * local_1018[3] + fVar101 * local_1008._12_4_));
              fVar39 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar47 = (ray->super_RayK<1>).tfar;
              auVar55._0_4_ =
                   -(uint)(local_1098._0_4_ <= fVar47 * fVar67 && fVar39 * fVar67 < local_1098._0_4_
                          ) & auVar72._0_4_;
              auVar55._4_4_ =
                   -(uint)(local_1098._4_4_ <= fVar47 * fVar70 && fVar39 * fVar70 < local_1098._4_4_
                          ) & auVar72._4_4_;
              auVar55._8_4_ =
                   -(uint)(local_1098._8_4_ <= fVar47 * local_1088._8_4_ &&
                          fVar39 * local_1088._8_4_ < local_1098._8_4_) & auVar72._8_4_;
              auVar55._12_4_ =
                   -(uint)(local_1098._12_4_ <= fVar47 * local_1088._12_4_ &&
                          fVar39 * local_1088._12_4_ < local_1098._12_4_) & auVar72._12_4_;
              iVar9 = movmskps(iVar9,auVar55);
              uVar11 = CONCAT44(uVar24,iVar9);
              if (iVar9 != 0) {
                local_1068 = auVar55;
                local_1028._4_4_ = fStack_1144;
                local_1028._0_4_ = local_1148;
                local_1028._8_4_ = fStack_1140;
                local_1028._12_4_ = fStack_113c;
                pSVar13 = pRVar14->scene;
                auVar40 = rcpps(local_1028,local_1088);
                fVar39 = auVar40._0_4_;
                fVar47 = auVar40._4_4_;
                fVar48 = auVar40._8_4_;
                fVar49 = auVar40._12_4_;
                fVar39 = (1.0 - fVar67 * fVar39) * fVar39 + fVar39;
                fVar47 = (1.0 - fVar70 * fVar47) * fVar47 + fVar47;
                fVar48 = (1.0 - local_1088._8_4_ * fVar48) * fVar48 + fVar48;
                fVar49 = (1.0 - local_1088._12_4_ * fVar49) * fVar49 + fVar49;
                local_1038[0] = local_1098._0_4_ * fVar39;
                local_1038[1] = local_1098._4_4_ * fVar47;
                local_1038[2] = local_1098._8_4_ * fVar48;
                local_1038[3] = local_1098._12_4_ * fVar49;
                local_1058[0] = (float)local_10b8._0_4_ * fVar39;
                local_1058[1] = (float)local_10b8._4_4_ * fVar47;
                local_1058[2] = fStack_10b0 * fVar48;
                local_1058[3] = fStack_10ac * fVar49;
                local_1168 = auVar55;
                local_1048[0] = fVar39 * local_10a8;
                local_1048[1] = fVar47 * fStack_10a4;
                local_1048[2] = fVar48 * fStack_10a0;
                local_1048[3] = fVar49 * fStack_109c;
                auVar31._0_4_ = auVar55._0_4_ & (uint)local_1038[0];
                auVar31._4_4_ = auVar55._4_4_ & (uint)local_1038[1];
                auVar31._8_4_ = auVar55._8_4_ & (uint)local_1038[2];
                auVar31._12_4_ = auVar55._12_4_ & (uint)local_1038[3];
                auVar61._0_8_ = CONCAT44(~auVar55._4_4_,~auVar55._0_4_) & 0x7f8000007f800000;
                auVar61._8_4_ = ~auVar55._8_4_ & 0x7f800000;
                auVar61._12_4_ = ~auVar55._12_4_ & 0x7f800000;
                auVar61 = auVar61 | auVar31;
                auVar46._4_4_ = auVar61._0_4_;
                auVar46._0_4_ = auVar61._4_4_;
                auVar46._8_4_ = auVar61._12_4_;
                auVar46._12_4_ = auVar61._8_4_;
                auVar40 = minps(auVar46,auVar61);
                auVar32._0_8_ = auVar40._8_8_;
                auVar32._8_4_ = auVar40._0_4_;
                auVar32._12_4_ = auVar40._4_4_;
                auVar40 = minps(auVar32,auVar40);
                auVar33._0_8_ =
                     CONCAT44(-(uint)(auVar40._4_4_ == auVar61._4_4_) & auVar55._4_4_,
                              -(uint)(auVar40._0_4_ == auVar61._0_4_) & auVar55._0_4_);
                auVar33._8_4_ = -(uint)(auVar40._8_4_ == auVar61._8_4_) & auVar55._8_4_;
                auVar33._12_4_ = -(uint)(auVar40._12_4_ == auVar61._12_4_) & auVar55._12_4_;
                iVar9 = movmskps(iVar9,auVar33);
                if (iVar9 != 0) {
                  auVar55._8_4_ = auVar33._8_4_;
                  auVar55._0_8_ = auVar33._0_8_;
                  auVar55._12_4_ = auVar33._12_4_;
                }
                lVar25 = lVar25 + uVar16;
                uVar10 = movmskps(iVar9,auVar55);
                piVar22 = (int *)0x0;
                if (CONCAT44(uVar24,uVar10) != 0) {
                  for (; (CONCAT44(uVar24,uVar10) >> (long)piVar22 & 1) == 0;
                      piVar22 = (int *)((long)piVar22 + 1)) {
                  }
                }
                local_1148 = SUB84(pSVar13,0);
                fStack_1144 = (float)((ulong)pSVar13 >> 0x20);
                fVar67 = local_1038[0];
                fVar70 = local_1038[1];
                fVar39 = local_1038[2];
                fVar47 = local_1038[3];
                do {
                  uVar26 = *(uint *)(lVar25 + 0x90 + (long)piVar22 * 4);
                  piVar12 = (int *)(ulong)uVar26;
                  pGVar5 = (pSVar13->geometries).items[(long)piVar12].ptr;
                  if ((pGVar5->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_1168 + (long)piVar22 * 4) = 0;
                  }
                  else {
                    if ((local_1178->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar67 = local_1058[(long)piVar22];
                      fVar70 = local_1048[(long)piVar22];
                      (ray->super_RayK<1>).tfar = local_1038[(long)piVar22];
                      (ray->Ng).field_0.field_0.x = *(float *)(local_1028 + (long)piVar22 * 4);
                      (ray->Ng).field_0.field_0.y = local_1018[(long)piVar22];
                      (ray->Ng).field_0.field_0.z = *(float *)(local_1008 + (long)piVar22 * 4);
                      ray->u = fVar67;
                      ray->v = fVar70;
                      ray->primID = *(uint *)(lVar25 + 0xa0 + (long)piVar22 * 4);
                      ray->geomID = uVar26;
                      pRVar6 = local_1178->user;
                      ray->instID[0] = pRVar6->instID[0];
                      uVar26 = pRVar6->instPrimID[0];
                      uVar11 = (ulong)uVar26;
                      ray->instPrimID[0] = uVar26;
                      break;
                    }
                    local_1150 = local_1178->args;
                    local_1108 = fVar67;
                    fStack_1104 = fVar70;
                    fStack_1100 = fVar39;
                    fStack_10fc = fVar47;
                    local_1138.context = local_1178->user;
                    local_10e8 = *(float *)(local_1028 + (long)piVar22 * 4);
                    local_10e4 = local_1018[(long)piVar22];
                    local_10e0 = *(undefined4 *)(local_1008 + (long)piVar22 * 4);
                    local_10dc = local_1058[(long)piVar22];
                    local_10d8 = local_1048[(long)piVar22];
                    local_10d4 = *(undefined4 *)(lVar25 + 0xa0 + (long)piVar22 * 4);
                    local_10d0 = uVar26;
                    local_10cc = (local_1138.context)->instID[0];
                    local_10c8 = (local_1138.context)->instPrimID[0];
                    fVar67 = (ray->super_RayK<1>).tfar;
                    local_10f0 = piVar22;
                    (ray->super_RayK<1>).tfar = local_1038[(long)piVar22];
                    local_117c = -1;
                    local_1138.valid = &local_117c;
                    local_1138.geometryUserPtr = pGVar5->userPtr;
                    local_1138.ray = (RTCRayN *)ray;
                    local_1138.hit = (RTCHitN *)&local_10e8;
                    local_1138.N = 1;
                    local_10f8 = pGVar5;
                    if ((pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar5->intersectionFilterN)(&local_1138), *local_1138.valid != 0)) {
                      if (local_1150->filter != (RTCFilterFunctionN)0x0) {
                        if (((local_1150->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((local_10f8->field_8).field_0x2 & 0x40) != 0)) {
                          (*local_1150->filter)(&local_1138);
                        }
                        if (*local_1138.valid == 0) goto LAB_00de7d78;
                      }
                      (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1138.hit;
                      (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1138.hit + 4);
                      (((Vec3f *)((long)local_1138.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1138.hit + 8);
                      *(float *)((long)local_1138.ray + 0x3c) = *(float *)(local_1138.hit + 0xc);
                      *(float *)((long)local_1138.ray + 0x40) = *(float *)(local_1138.hit + 0x10);
                      *(float *)((long)local_1138.ray + 0x44) = *(float *)(local_1138.hit + 0x14);
                      *(float *)((long)local_1138.ray + 0x48) = *(float *)(local_1138.hit + 0x18);
                      *(float *)((long)local_1138.ray + 0x4c) = *(float *)(local_1138.hit + 0x1c);
                      *(float *)((long)local_1138.ray + 0x50) = *(float *)(local_1138.hit + 0x20);
                    }
                    else {
LAB_00de7d78:
                      (ray->super_RayK<1>).tfar = fVar67;
                    }
                    piVar12 = local_10f0;
                    *(undefined4 *)(local_1168 + (long)local_10f0 * 4) = 0;
                    fVar67 = (ray->super_RayK<1>).tfar;
                    local_1168._0_4_ = -(uint)(local_1108 <= fVar67) & local_1168._0_4_;
                    local_1168._4_4_ = -(uint)(fStack_1104 <= fVar67) & local_1168._4_4_;
                    local_1168._8_4_ = -(uint)(fStack_1100 <= fVar67) & local_1168._8_4_;
                    local_1168._12_4_ = -(uint)(fStack_10fc <= fVar67) & local_1168._12_4_;
                    fVar67 = local_1108;
                    fVar70 = fStack_1104;
                    fVar39 = fStack_1100;
                    fVar47 = fStack_10fc;
                  }
                  iVar9 = movmskps((int)piVar12,local_1168);
                  uVar11 = CONCAT44((int)((ulong)piVar12 >> 0x20),iVar9);
                  if (iVar9 == 0) break;
                  local_1108 = fVar67;
                  fStack_1104 = fVar70;
                  fStack_1100 = fVar39;
                  fStack_10fc = fVar47;
                  BVHNIntersector1<4,1,false,embree::sse2::ArrayIntersector1<embree::sse2::TriangleMIntersector1Moeller<4,true>>>
                  ::intersect();
                  pSVar13 = (Scene *)CONCAT44(fStack_1144,local_1148);
                  piVar22 = local_1138.valid;
                  fVar67 = local_1108;
                  fVar70 = fStack_1104;
                  fVar39 = fStack_1100;
                  fVar47 = fStack_10fc;
                } while( true );
              }
            }
            lVar17 = lVar17 + 1;
            pRVar14 = local_1178;
          } while (lVar17 != uVar15 - 8);
        }
        fVar67 = (ray->super_RayK<1>).tfar;
        auVar40._4_4_ = fVar67;
        auVar40._0_4_ = fVar67;
        auVar40._8_4_ = fVar67;
        auVar40._12_4_ = fVar67;
        fVar67 = local_f98;
        fVar70 = fStack_f94;
        fVar39 = fStack_f90;
        fVar47 = fStack_f8c;
        fVar48 = local_fa8;
        fVar49 = fStack_fa4;
        fVar78 = fStack_fa0;
        fVar80 = fStack_f9c;
        fVar82 = local_fb8;
        fVar84 = fStack_fb4;
        fVar86 = fStack_fb0;
        fVar88 = fStack_fac;
        fVar90 = local_fc8;
        fVar91 = fStack_fc4;
        fVar92 = fStack_fc0;
        fVar93 = fStack_fbc;
        fVar94 = local_fd8;
        fVar96 = fStack_fd4;
        fVar98 = fStack_fd0;
        fVar100 = fStack_fcc;
        fVar64 = local_fe8;
        fVar101 = fStack_fe4;
        fVar75 = fStack_fe0;
        fVar105 = fStack_fdc;
        fVar107 = local_ff8;
        fVar108 = fStack_ff4;
        fVar109 = fStack_ff0;
        fVar110 = fStack_fec;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }